

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorShowLabel::dragEnterEvent(QColorShowLabel *this,QDragEnterEvent *e)

{
  bool bVar1;
  QMimeData *pQVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QDropEvent *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QColor QVar3;
  QColor local_48;
  QColor local_38;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QDropEvent::mimeData(in_RSI);
  __fd = (int)pQVar2;
  QMimeData::colorData();
  QVar3 = qvariant_cast<QColor>(in_RDI);
  local_48._0_8_ = QVar3._0_8_;
  local_38._0_8_ = local_48._0_8_;
  local_48.ct._4_4_ = QVar3.ct._4_4_;
  local_38.ct._4_4_ = local_48.ct._4_4_;
  local_48.ct._8_2_ = QVar3.ct._8_2_;
  local_38.ct.argb.pad = local_48.ct._8_2_;
  bVar1 = QColor::isValid(&local_38);
  ::QVariant::~QVariant(&local_28);
  if (bVar1) {
    QDragMoveEvent::accept((QDragMoveEvent *)in_RSI,__fd,__addr,in_RCX);
  }
  else {
    QDragMoveEvent::ignore((QDragMoveEvent *)0x7341e2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShowLabel::dragEnterEvent(QDragEnterEvent *e)
{
    if (qvariant_cast<QColor>(e->mimeData()->colorData()).isValid())
        e->accept();
    else
        e->ignore();
}